

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketServer.cpp
# Opt level: O2

bool __thiscall SocketServer::commonListen(SocketServer *this)

{
  FILE *__stream;
  bool bVar1;
  int iVar2;
  int *piVar3;
  int __fd;
  bool bVar4;
  _Any_data local_68 [2];
  SharedPtr loop;
  _Bind<void_(SocketServer::*(SocketServer_*,_std::_Placeholder<1>,_std::_Placeholder<2>))(int,_int)>
  local_38;
  int __fd_00;
  
  __fd = (int)local_68;
  __fd_00 = (int)local_68;
  iVar2 = ::listen(this->fd,0x80);
  __stream = _stderr;
  if (iVar2 < 0) {
    piVar3 = __errno_location();
    Rct::strerror((Rct *)local_68[0]._M_pod_data,*piVar3);
    bVar4 = false;
    fprintf(__stream,"::listen() failed with errno: %s\n",local_68[0]._M_unused._M_object);
    std::__cxx11::string::~string((string *)local_68[0]._M_pod_data);
    local_38._M_f = CONCAT44(local_38._M_f._4_4_,2);
    local_68[0]._0_8_ = this;
    Signal<std::function<void(SocketServer*,SocketServer::Error)>>::operator()
              (&this->serverError,(SocketServer **)local_68,(Error *)&local_38);
    close(this,__fd_00);
  }
  else {
    EventLoop::eventLoop();
    bVar4 = true;
    if (loop.super___shared_ptr<EventLoop,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0
       ) {
      iVar2 = this->fd;
      local_38._M_f = (offset_in_SocketServer_to_subr)socketCallback;
      local_38._8_8_ = 0;
      local_38._M_bound_args.
      super__Tuple_impl<0UL,_SocketServer_*,_std::_Placeholder<1>,_std::_Placeholder<2>_>.
      super__Head_base<0UL,_SocketServer_*,_false>._M_head_impl =
           (_Tuple_impl<0UL,_SocketServer_*,_std::_Placeholder<1>,_std::_Placeholder<2>_>)
           (_Tuple_impl<0UL,_SocketServer_*,_std::_Placeholder<1>,_std::_Placeholder<2>_>)this;
      std::function<void(int,unsigned_int)>::
      function<std::_Bind<void(SocketServer::*(SocketServer*,std::_Placeholder<1>,std::_Placeholder<2>))(int,int)>,void>
                ((function<void(int,unsigned_int)> *)local_68[0]._M_pod_data,&local_38);
      EventLoop::registerSocket
                (loop.super___shared_ptr<EventLoop,_(__gnu_cxx::_Lock_policy)2>._M_ptr,iVar2,1,
                 (function<void_(int,_unsigned_int)> *)local_68);
      std::_Function_base::~_Function_base((_Function_base *)local_68);
      bVar1 = SocketClient::setFlags(this->fd,0x800,3,4,FlagAppend);
      if (!bVar1) {
        local_38._M_f = local_38._M_f & 0xffffffff00000000;
        local_68[0]._0_8_ = this;
        Signal<std::function<void(SocketServer*,SocketServer::Error)>>::operator()
                  (&this->serverError,(SocketServer **)local_68,(Error *)&local_38);
        close(this,__fd);
        bVar4 = false;
      }
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&loop.super___shared_ptr<EventLoop,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  }
  return bVar4;
}

Assistant:

bool SocketServer::commonListen()
{
    // ### should be able to customize the backlog
    enum { Backlog = 128 };
    if (::listen(fd, Backlog) < 0) {
        fprintf(stderr, "::listen() failed with errno: %s\n",
                Rct::strerror().constData());

        serverError(this, ListenError);
        close();
        return false;
    }

    if (EventLoop::SharedPtr loop = EventLoop::eventLoop()) {
        loop->registerSocket(fd, EventLoop::SocketRead,
                             //|EventLoop::SocketWrite,
                             std::bind(&SocketServer::socketCallback,
                                       this,
                                       std::placeholders::_1,
                                       std::placeholders::_2));
#ifndef _WIN32
        if (!SocketClient::setFlags(fd, O_NONBLOCK, F_GETFL, F_SETFL)) {
            serverError(this, InitializeError);
            close();
            return false;
        }
#endif
    }

    return true;
}